

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogException *
duckdb::Catalog::UnrecognizedConfigurationError
          (CatalogException *__return_storage_ptr__,ClientContext *context,string *name)

{
  DBConfig *pDVar1;
  CatalogException *__return_storage_ptr___00;
  ExtensionEntry (*in_RCX) [62];
  __node_base *p_Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  potential_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string extension_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ExtensionHelper::FindExtensionInEntries<62ul>
            (&extension_name,(ExtensionHelper *)name,(string *)"azure_account_name",in_RCX);
  if (extension_name._M_string_length != 0) {
    ::std::operator+(&local_48,"Setting with name \"",name);
    ::std::operator+(&local_88,&local_48,"\" is not in the catalog, but it exists in the ");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &potential_names,&local_88,&extension_name);
    ::std::operator+(&error_message,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &potential_names," extension.");
    ::std::__cxx11::string::~string((string *)&potential_names);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_48);
    ExtensionHelper::AddExtensionInstallHintToErrorMsg
              ((string *)&potential_names,context,&error_message,&extension_name);
    ::std::__cxx11::string::operator=((string *)&error_message,(string *)&potential_names);
    ::std::__cxx11::string::~string((string *)&potential_names);
    CatalogException::CatalogException(__return_storage_ptr__,&error_message);
    ::std::__cxx11::string::~string((string *)&error_message);
    ::std::__cxx11::string::~string((string *)&extension_name);
    return __return_storage_ptr__;
  }
  DBConfig::GetOptionNames_abi_cxx11_();
  pDVar1 = DBConfig::GetConfig(context);
  p_Var2 = &(pDVar1->extension_parameters)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&potential_names,(value_type *)(p_Var2 + 1));
  }
  __return_storage_ptr___00 = (CatalogException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&error_message,"configuration parameter",(allocator *)&local_88);
  CatalogException::MissingEntry
            (__return_storage_ptr___00,&error_message,name,&potential_names,
             (QueryErrorContext)0xffffffffffffffff);
  __cxa_throw(__return_storage_ptr___00,&CatalogException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

CatalogException Catalog::UnrecognizedConfigurationError(ClientContext &context, const string &name) {
	// check if the setting exists in any extensions
	auto extension_name = ExtensionHelper::FindExtensionInEntries(name, EXTENSION_SETTINGS);
	if (!extension_name.empty()) {
		auto error_message = "Setting with name \"" + name + "\" is not in the catalog, but it exists in the " +
		                     extension_name + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(context, error_message, extension_name);
		return CatalogException(error_message);
	}
	// the setting is not in an extension
	// get a list of all options
	vector<string> potential_names = DBConfig::GetOptionNames();
	for (auto &entry : DBConfig::GetConfig(context).extension_parameters) {
		potential_names.push_back(entry.first);
	}
	throw CatalogException::MissingEntry("configuration parameter", name, potential_names);
}